

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sorcerer.c
# Opt level: O3

void spell_sphere_of_plasma(int sn,int level,CHAR_DATA *ch,void *vo,int target)

{
  bool bVar1;
  int iVar2;
  AFFECT_DATA af;
  AFFECT_DATA local_90;
  
  bVar1 = is_affected(ch,(int)gsn_sphere_of_plasma);
  if (bVar1) {
    send_to_char("You cannot create another sphere of plasma yet.\n\r",ch);
    return;
  }
  act("Rippling links of plasma join to form a massive sphere of plasma around you!",ch,(void *)0x0,
      (void *)0x0,3);
  act("Rippling links of plasma join to form a massive sphere of plasma around $n!",ch,(void *)0x0,
      (void *)0x0,0);
  init_affect(&local_90);
  local_90.where = 0;
  local_90.aftype = 0;
  local_90.type = (short)sn;
  local_90.location = 0;
  local_90.owner = ch;
  local_90.level = (short)level;
  iVar2 = dice(level / 0xd,2);
  local_90.modifier = (short)iVar2;
  local_90.duration =
       (short)(uint)((ulong)((long)level * 0x66666667) >> 0x21) - (short)(level >> 0x1f);
  local_90.end_fun = sphere_of_plasma_end;
  local_90.pulse_fun = sphere_of_plasma_pulse;
  local_90.mod_name = 8;
  affect_to_char(ch,&local_90);
  die_follower(ch);
  return;
}

Assistant:

void spell_sphere_of_plasma(int sn, int level, CHAR_DATA *ch, void *vo, int target)
{
	AFFECT_DATA af;

	if (is_affected(ch, gsn_sphere_of_plasma))
	{
		send_to_char("You cannot create another sphere of plasma yet.\n\r", ch);
		return;
	}

	act("Rippling links of plasma join to form a massive sphere of plasma around you!", ch, nullptr, nullptr, TO_CHAR);
	act("Rippling links of plasma join to form a massive sphere of plasma around $n!", ch, nullptr, nullptr, TO_ROOM);

	init_affect(&af);
	af.where = TO_AFFECTS;
	af.aftype = AFT_SPELL;
	af.type = sn;
	af.level = level;
	af.owner = ch;
	af.location = 0;
	af.modifier = dice(level / 13, 2);
	af.duration = level / 5;
	af.end_fun = sphere_of_plasma_end;
	af.pulse_fun = sphere_of_plasma_pulse;
	af.mod_name = MOD_PROTECTION;
	affect_to_char(ch, &af);

	die_follower(ch);
}